

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O2

void Ssc_GiaSimProcessRefined(Gia_Man_t *p,Vec_Int_t *vRefined)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Rpr_t GVar4;
  void *__ptr;
  word *pwVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  iVar2 = vRefined->nSize;
  if (iVar2 == 0) {
    return;
  }
  uVar7 = iVar2 / 3 + 99;
  do {
    do {
      uVar8 = uVar7 + 1;
      uVar1 = uVar7 & 1;
      uVar7 = uVar8;
    } while (uVar1 != 0);
    uVar9 = 3;
    do {
      iVar10 = (int)uVar9;
      if (uVar8 < (uint)(iVar10 * iVar10)) {
        __ptr = calloc((long)(int)uVar8,4);
        iVar10 = 0;
        do {
          if (iVar2 <= iVar10) {
            for (iVar10 = 0; iVar10 < iVar2; iVar10 = iVar10 + 1) {
              iVar2 = Vec_IntEntry(vRefined,iVar10);
              iVar3 = Gia_ObjIsHead(p,iVar2);
              if (iVar3 != 0) {
                Ssc_GiaSimClassRefineOne(p,iVar2);
              }
              iVar2 = vRefined->nSize;
            }
            free(__ptr);
            return;
          }
          iVar2 = Vec_IntEntry(vRefined,iVar10);
          iVar3 = Ssc_GiaSimIsConst0(p,iVar2);
          if (iVar3 != 0) {
            __assert_fail("!Ssc_GiaSimIsConst0( p, i )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                          ,0xe6,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
          }
          pwVar5 = Gia_ObjSim(p,iVar2);
          uVar9 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
          uVar6 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
            uVar6 = 0;
          }
          if ((*pwVar5 & 1) == 0) {
            uVar7 = 0;
            for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
              uVar7 = uVar7 ^ *(int *)(Ssc_GiaSimHashKey_s_Primes + (ulong)((uint)uVar9 & 0xf) * 4)
                              * (int)pwVar5[uVar9];
            }
          }
          else {
            uVar7 = 0;
            for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
              uVar7 = uVar7 ^ ~(uint)pwVar5[uVar9] *
                              *(int *)(Ssc_GiaSimHashKey_s_Primes + (ulong)((uint)uVar9 & 0xf) * 4);
            }
          }
          iVar3 = *(int *)((long)__ptr + (long)(int)(uVar7 % uVar8) * 4);
          lVar11 = (long)iVar3;
          if (lVar11 == 0) {
            GVar4 = p->pReprs[iVar2];
            if (((uint)GVar4 & 0xfffffff) != 0) {
              __assert_fail("Gia_ObjRepr(p, i) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                            ,0xea,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
            }
            if (p->pNexts[iVar2] != 0) {
              __assert_fail("Gia_ObjNext(p, i) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                            ,0xeb,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
            }
            p->pReprs[iVar2] = (Gia_Rpr_t)((uint)GVar4 | 0xfffffff);
          }
          else {
            p->pNexts[lVar11] = iVar2;
            Gia_ObjSetRepr(p,iVar2,(uint)p->pReprs[lVar11] & 0xfffffff);
            GVar4 = p->pReprs[iVar2];
            if ((~(uint)GVar4 & 0xfffffff) == 0) {
              Gia_ObjSetRepr(p,iVar2,iVar3);
              GVar4 = p->pReprs[iVar2];
            }
            if (((uint)GVar4 & 0xfffffff) == 0) {
              __assert_fail("Gia_ObjRepr(p, i) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                            ,0xf4,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
            }
          }
          *(int *)((long)__ptr + (long)(int)(uVar7 % uVar8) * 4) = iVar2;
          iVar10 = iVar10 + 1;
          iVar2 = vRefined->nSize;
        } while( true );
      }
      uVar6 = (ulong)uVar8 % uVar9;
      uVar9 = (ulong)(iVar10 + 2);
    } while ((int)uVar6 != 0);
  } while( true );
}

Assistant:

void Ssc_GiaSimProcessRefined( Gia_Man_t * p, Vec_Int_t * vRefined )
{
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 100 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        assert( !Ssc_GiaSimIsConst0( p, i ) );
        Key = Ssc_GiaSimHashKey( p, i, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p, i) == 0 );
            assert( Gia_ObjNext(p, i) == 0 );
            Gia_ObjSetRepr( p, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p, pTable[Key], i );
            Gia_ObjSetRepr( p, i, Gia_ObjRepr(p, pTable[Key]) );
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                Gia_ObjSetRepr( p, i, pTable[Key] );
            assert( Gia_ObjRepr(p, i) > 0 );
        }
        pTable[Key] = i;
    }
    Vec_IntForEachEntry( vRefined, i, k )
        if ( Gia_ObjIsHead( p, i ) )
            Ssc_GiaSimClassRefineOne( p, i );
    ABC_FREE( pTable );
}